

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O0

QSharedPointer<QIconCacheGtkReader>
QSharedPointer<QIconCacheGtkReader>::create<QString&>(QString *arguments)

{
  ExternalRefCountData *pEVar1;
  Data *extraout_RDX;
  totally_ordered_wrapper<QIconCacheGtkReader_*> in_RDI;
  long in_FS_OFFSET;
  QSharedPointer<QIconCacheGtkReader> QVar2;
  DestroyerFn noDestroy;
  DestroyerFn destroy;
  QSharedPointer<QIconCacheGtkReader> *result;
  type *ptr;
  DestroyerFn in_stack_ffffffffffffffb8;
  Data *this;
  totally_ordered_wrapper<QIconCacheGtkReader_*> this_00;
  QIconCacheGtkReader *pQVar3;
  QIconCacheGtkReader *this_01;
  
  this_01 = *(QIconCacheGtkReader **)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.ptr = &DAT_aaaaaaaaaaaaaaaa;
  *(Data **)&(in_RDI.ptr)->field_0x8 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  this_00.ptr = in_RDI.ptr;
  QSharedPointer((QSharedPointer<QIconCacheGtkReader> *)in_RDI.ptr,Uninitialized);
  pQVar3 = (QIconCacheGtkReader *)&DAT_aaaaaaaaaaaaaaaa;
  pEVar1 = QtSharedPointer::ExternalRefCountWithContiguousData<QIconCacheGtkReader>::create
                     ((NoCVType **)this_00.ptr,in_stack_ffffffffffffffb8);
  *(ExternalRefCountData **)&(this_00.ptr)->field_0x8 = pEVar1;
  QIconCacheGtkReader::QIconCacheGtkReader(this_01,(QString *)pQVar3);
  Qt::totally_ordered_wrapper<QIconCacheGtkReader_*>::reset
            ((totally_ordered_wrapper<QIconCacheGtkReader_*> *)this_00.ptr,pQVar3);
  (*(Data **)&(this_00.ptr)->field_0x8)->destroyer =
       QtSharedPointer::ExternalRefCountWithContiguousData<QIconCacheGtkReader>::deleter;
  this = *(Data **)&(this_00.ptr)->field_0x8;
  pQVar3 = Qt::totally_ordered_wrapper<QIconCacheGtkReader_*>::get(this_00.ptr);
  QtSharedPointer::ExternalRefCountData::setQObjectShared(this,pQVar3,1);
  pQVar3 = data((QSharedPointer<QIconCacheGtkReader> *)0x2a5b29);
  enableSharedFromThis((QSharedPointer<QIconCacheGtkReader> *)this_00.ptr,pQVar3);
  if (*(QIconCacheGtkReader **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  QVar2.d = extraout_RDX;
  QVar2.value.ptr = in_RDI.ptr;
  return QVar2;
}

Assistant:

[[nodiscard]] static QSharedPointer create(Args && ...arguments)
    {
        typedef QtSharedPointer::ExternalRefCountWithContiguousData<T> Private;
# ifdef QT_SHAREDPOINTER_TRACK_POINTERS
        typename Private::DestroyerFn destroy = &Private::safetyCheckDeleter;
# else
        typename Private::DestroyerFn destroy = &Private::deleter;
# endif
        typename Private::DestroyerFn noDestroy = &Private::noDeleter;
        QSharedPointer result(Qt::Uninitialized);
        typename std::remove_cv<T>::type *ptr;
        result.d = Private::create(&ptr, noDestroy);

        // now initialize the data
        new (ptr) T(std::forward<Args>(arguments)...);
        result.value.reset(ptr);
        result.d->destroyer = destroy;
        result.d->setQObjectShared(result.value.get(), true);
# ifdef QT_SHAREDPOINTER_TRACK_POINTERS
        internalSafetyCheckAdd(result.d, result.value.get());
# endif
        result.enableSharedFromThis(result.data());
        return result;
    }